

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

uint __thiscall ON_PolyCurve::SizeOf(ON_PolyCurve *this)

{
  uint uVar1;
  ON_Curve *pOVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = ON_Curve::SizeOf(&this->super_ON_Curve);
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar3 = uVar3 + ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_capacity +
                  (this->m_t).m_capacity) * 8 + 0x30;
  uVar6 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar6];
    if (pOVar2 != (ON_Curve *)0x0) {
      iVar4 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[8])();
      uVar3 = uVar3 + iVar4;
    }
  }
  return uVar3;
}

Assistant:

unsigned int ON_PolyCurve::SizeOf() const
{
  unsigned int sz = ON_Curve::SizeOf();
  sz += (sizeof(*this) - sizeof(ON_Curve));
  sz += m_t.SizeOfArray();
  sz += m_segment.SizeOfArray();
  int i, count = m_segment.Count();
  for ( i = 0; i < count; i++ )
  {
    const ON_Curve* crv = m_segment[i];
    if ( crv )
      sz += crv->SizeOf();
  }
  return sz;
}